

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

bool __thiscall Catch::XmlReporter::assertionEnded(XmlReporter *this,AssertionStats *assertionStats)

{
  XmlWriter *pXVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  OfType OVar3;
  pointer pMVar4;
  pointer pcVar5;
  undefined8 uVar6;
  int iVar7;
  byte bVar8;
  XmlFormatting fmt;
  pointer pMVar9;
  string local_b0;
  XmlReporter *local_90;
  undefined1 local_88 [16];
  undefined1 local_78 [16];
  string local_68;
  undefined1 local_48 [16];
  ostream *poStack_38;
  
  local_90 = this;
  iVar7 = (*(((this->super_StreamingReporterBase<Catch::XmlReporter>).m_config.
              super___shared_ptr<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
            super_NonCopyable)._vptr_NonCopyable[5])();
  bVar8 = 1;
  if ((char)iVar7 == '\0') {
    bVar8 = ((assertionStats->assertionResult).m_info.resultDisposition & SuppressFail) == 0 &
            (byte)(char)(assertionStats->assertionResult).m_resultData.resultType >> 4;
  }
  local_48._0_8_ = assertionStats;
  if ((bVar8 != 0) || ((assertionStats->assertionResult).m_resultData.resultType == Warning)) {
    pMVar9 = (assertionStats->infoMessages).
             super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>._M_impl.
             super__Vector_impl_data._M_start;
    pMVar4 = (assertionStats->infoMessages).
             super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (pMVar9 != pMVar4) {
      pXVar1 = &local_90->m_xml;
      do {
        fmt = (XmlFormatting)&local_b0;
        if (pMVar9->type == Info && bVar8 == 1) {
          local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"Info","");
          XmlWriter::scopedElement((XmlWriter *)local_88,(string *)pXVar1,fmt);
          XmlWriter::writeText((XmlWriter *)local_88._0_8_,&pMVar9->message,Newline|Indent);
LAB_00132313:
          XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)local_88);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
            operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
          }
        }
        else if (pMVar9->type == Warning) {
          local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"Warning","");
          XmlWriter::scopedElement((XmlWriter *)local_88,(string *)pXVar1,fmt);
          XmlWriter::writeText((XmlWriter *)local_88._0_8_,&pMVar9->message,Newline|Indent);
          goto LAB_00132313;
        }
        pMVar9 = pMVar9 + 1;
      } while (pMVar9 != pMVar4);
    }
  }
  uVar6 = local_48._0_8_;
  if ((bVar8 | *(OfType *)(local_48._0_8_ + 0x90) == Warning) == 1) {
    if (*(size_type *)(local_48._0_8_ + 0x30) != 0) {
      paVar2 = &local_b0.field_2;
      local_b0._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"Expression","");
      pXVar1 = &local_90->m_xml;
      XmlWriter::startElement(pXVar1,&local_b0,Newline|Indent);
      local_88._0_8_ = (XmlWriter *)local_78;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_88,"success","");
      XmlWriter::writeAttribute
                (pXVar1,(string *)local_88,(*(undefined1 *)(uVar6 + 0x90) & FailureBit) == Ok);
      local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)(local_78 + 0x10),"type","");
      local_48._8_8_ = (((AssertionResult *)(uVar6 + 8))->m_info).macroName.m_start;
      poStack_38 = *(ostream **)(uVar6 + 0x10);
      XmlWriter::writeAttribute<Catch::StringRef>
                (pXVar1,(string *)(local_78 + 0x10),(StringRef *)(local_48 + 8));
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_68._M_dataplus._M_p != &local_68.field_2) {
        operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
      }
      if ((XmlWriter *)local_88._0_8_ != (XmlWriter *)local_78) {
        operator_delete((void *)local_88._0_8_,(ulong)(local_78._0_8_ + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p != paVar2) {
        operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
      }
      local_b0._M_dataplus._M_p = ((SourceLineInfo *)(uVar6 + 0x18))->file;
      local_b0._M_string_length = *(size_t *)(uVar6 + 0x20);
      writeSourceInfo(local_90,(SourceLineInfo *)&local_b0);
      local_b0._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"Original","");
      XmlWriter::scopedElement
                ((XmlWriter *)(local_78 + 0x10),(string *)pXVar1,(XmlFormatting)&local_b0);
      AssertionResult::getExpression_abi_cxx11_((string *)local_88,(AssertionResult *)(uVar6 + 8));
      XmlWriter::writeText((XmlWriter *)local_68._M_dataplus._M_p,(string *)local_88,Newline|Indent)
      ;
      if ((XmlWriter *)local_88._0_8_ != (XmlWriter *)local_78) {
        operator_delete((void *)local_88._0_8_,(ulong)(local_78._0_8_ + 1));
      }
      XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)(local_78 + 0x10));
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p != paVar2) {
        operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
      }
      local_b0._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"Expanded","");
      XmlWriter::scopedElement
                ((XmlWriter *)(local_78 + 0x10),(string *)pXVar1,(XmlFormatting)&local_b0);
      AssertionResult::getExpandedExpression_abi_cxx11_
                ((string *)local_88,(AssertionResult *)(uVar6 + 8));
      XmlWriter::writeText((XmlWriter *)local_68._M_dataplus._M_p,(string *)local_88,Newline|Indent)
      ;
      if ((XmlWriter *)local_88._0_8_ != (XmlWriter *)local_78) {
        operator_delete((void *)local_88._0_8_,(ulong)(local_78._0_8_ + 1));
      }
      XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)(local_78 + 0x10));
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p != paVar2) {
        operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
      }
    }
    OVar3 = *(OfType *)(uVar6 + 0x90);
    if (OVar3 < ExplicitFailure) {
      if (OVar3 == Info) {
        local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"Info","");
        XmlWriter::scopedElement
                  ((XmlWriter *)(local_78 + 0x10),(string *)&local_90->m_xml,
                   (XmlFormatting)&local_b0);
        pcVar5 = (((AssertionResultData *)(uVar6 + 0x40))->message)._M_dataplus._M_p;
        local_88._0_8_ = (XmlWriter *)local_78;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_88,pcVar5,pcVar5 + *(size_type *)(uVar6 + 0x48));
        XmlWriter::writeText
                  ((XmlWriter *)local_68._M_dataplus._M_p,(string *)local_88,Newline|Indent);
        if ((XmlWriter *)local_88._0_8_ != (XmlWriter *)local_78) {
          operator_delete((void *)local_88._0_8_,(ulong)(local_78._0_8_ + 1));
        }
        XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)(local_78 + 0x10));
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
          operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
        }
      }
    }
    else if (OVar3 == ExplicitFailure) {
      paVar2 = &local_b0.field_2;
      local_b0._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"Failure","");
      pXVar1 = &local_90->m_xml;
      XmlWriter::startElement(pXVar1,&local_b0,Newline|Indent);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p != paVar2) {
        operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
      }
      local_b0._M_dataplus._M_p = ((SourceLineInfo *)(uVar6 + 0x18))->file;
      local_b0._M_string_length = *(size_t *)(uVar6 + 0x20);
      writeSourceInfo(local_90,(SourceLineInfo *)&local_b0);
      pcVar5 = (((AssertionResultData *)(uVar6 + 0x40))->message)._M_dataplus._M_p;
      local_b0._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_b0,pcVar5,pcVar5 + *(size_type *)(uVar6 + 0x48));
      XmlWriter::writeText(pXVar1,&local_b0,Newline|Indent);
      assertionEnded();
    }
    else if (OVar3 == FatalErrorCondition) {
      paVar2 = &local_b0.field_2;
      local_b0._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"FatalErrorCondition","");
      pXVar1 = &local_90->m_xml;
      XmlWriter::startElement(pXVar1,&local_b0,Newline|Indent);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p != paVar2) {
        operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
      }
      local_b0._M_dataplus._M_p = ((SourceLineInfo *)(uVar6 + 0x18))->file;
      local_b0._M_string_length = *(size_t *)(uVar6 + 0x20);
      writeSourceInfo(local_90,(SourceLineInfo *)&local_b0);
      pcVar5 = (((AssertionResultData *)(uVar6 + 0x40))->message)._M_dataplus._M_p;
      local_b0._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_b0,pcVar5,pcVar5 + *(size_type *)(uVar6 + 0x48));
      XmlWriter::writeText(pXVar1,&local_b0,Newline|Indent);
      assertionEnded();
    }
    else if (OVar3 == ThrewException) {
      paVar2 = &local_b0.field_2;
      local_b0._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"Exception","");
      pXVar1 = &local_90->m_xml;
      XmlWriter::startElement(pXVar1,&local_b0,Newline|Indent);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p != paVar2) {
        operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
      }
      local_b0._M_dataplus._M_p = ((SourceLineInfo *)(uVar6 + 0x18))->file;
      local_b0._M_string_length = *(size_t *)(uVar6 + 0x20);
      writeSourceInfo(local_90,(SourceLineInfo *)&local_b0);
      pcVar5 = (((AssertionResultData *)(uVar6 + 0x40))->message)._M_dataplus._M_p;
      local_b0._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_b0,pcVar5,pcVar5 + *(size_type *)(uVar6 + 0x48));
      XmlWriter::writeText(pXVar1,&local_b0,Newline|Indent);
      assertionEnded();
    }
    if (*(size_type *)(uVar6 + 0x30) != 0) {
      XmlWriter::endElement(&local_90->m_xml,Newline|Indent);
    }
  }
  return true;
}

Assistant:

bool XmlReporter::assertionEnded( AssertionStats const& assertionStats ) {

        AssertionResult const& result = assertionStats.assertionResult;

        bool includeResults = m_config->includeSuccessfulResults() || !result.isOk();

        if( includeResults || result.getResultType() == ResultWas::Warning ) {
            // Print any info messages in <Info> tags.
            for( auto const& msg : assertionStats.infoMessages ) {
                if( msg.type == ResultWas::Info && includeResults ) {
                    m_xml.scopedElement( "Info" )
                            .writeText( msg.message );
                } else if ( msg.type == ResultWas::Warning ) {
                    m_xml.scopedElement( "Warning" )
                            .writeText( msg.message );
                }
            }
        }

        // Drop out if result was successful but we're not printing them.
        if( !includeResults && result.getResultType() != ResultWas::Warning )
            return true;

        // Print the expression if there is one.
        if( result.hasExpression() ) {
            m_xml.startElement( "Expression" )
                .writeAttribute( "success", result.succeeded() )
                .writeAttribute( "type", result.getTestMacroName() );

            writeSourceInfo( result.getSourceInfo() );

            m_xml.scopedElement( "Original" )
                .writeText( result.getExpression() );
            m_xml.scopedElement( "Expanded" )
                .writeText( result.getExpandedExpression() );
        }

        // And... Print a result applicable to each result type.
        switch( result.getResultType() ) {
            case ResultWas::ThrewException:
                m_xml.startElement( "Exception" );
                writeSourceInfo( result.getSourceInfo() );
                m_xml.writeText( result.getMessage() );
                m_xml.endElement();
                break;
            case ResultWas::FatalErrorCondition:
                m_xml.startElement( "FatalErrorCondition" );
                writeSourceInfo( result.getSourceInfo() );
                m_xml.writeText( result.getMessage() );
                m_xml.endElement();
                break;
            case ResultWas::Info:
                m_xml.scopedElement( "Info" )
                    .writeText( result.getMessage() );
                break;
            case ResultWas::Warning:
                // Warning will already have been written
                break;
            case ResultWas::ExplicitFailure:
                m_xml.startElement( "Failure" );
                writeSourceInfo( result.getSourceInfo() );
                m_xml.writeText( result.getMessage() );
                m_xml.endElement();
                break;
            default:
                break;
        }

        if( result.hasExpression() )
            m_xml.endElement();

        return true;
    }